

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLoggerMgr::addRawStackInfo(SimpleLoggerMgr *this,bool crash_origin)

{
  reference pRVar1;
  size_t sVar2;
  uint64_t uVar3;
  byte in_SIL;
  RawStackInfo *in_RDI;
  size_t ii;
  id tid;
  RawStackInfo *stack_info;
  size_t len;
  void *stack_ptr [256];
  value_type *in_stack_fffffffffffff758;
  pointer *this_00;
  vector<void_*,_std::allocator<void_*>_> *this_01;
  ulong local_888;
  vector<void_*,_std::allocator<void_*>_> local_850 [2];
  size_t local_820;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_820 = _stack_backtrace((void **)in_RDI,(size_t)in_stack_fffffffffffff758);
  this_00 = &in_RDI[0x16].stackPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  this_01 = local_850;
  RawStackInfo::RawStackInfo(in_RDI);
  std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>::
  push_back((vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_> *
            )in_RDI,in_stack_fffffffffffff758);
  RawStackInfo::~RawStackInfo((RawStackInfo *)0x1884ff);
  std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>::rbegin
            ((vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
              *)this_00);
  pRVar1 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<SimpleLoggerMgr::RawStackInfo_*,_std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>_>_>
           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<SimpleLoggerMgr::RawStackInfo_*,_std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>_>_>
                        *)in_RDI);
  std::this_thread::get_id();
  sVar2 = std::hash<std::thread::id>::operator()
                    ((hash<std::thread::id> *)in_RDI,(id *)in_stack_fffffffffffff758);
  pRVar1->tidHash = (uint)sVar2 & 0xffff;
  uVar3 = syscall(0xba);
  pRVar1->kernelTid = uVar3;
  pRVar1->crashOrigin = (bool)(local_9 & 1);
  for (local_888 = 0; local_888 < local_820; local_888 = local_888 + 1) {
    std::vector<void_*,_std::allocator<void_*>_>::push_back(this_01,this_00);
  }
  return;
}

Assistant:

void SimpleLoggerMgr::addRawStackInfo(bool crash_origin) {
#if defined(__linux__) || defined(__APPLE__)
    void* stack_ptr[256];
    size_t len = _stack_backtrace(stack_ptr, 256);

    crashDumpThreadStacks.push_back(RawStackInfo());
    RawStackInfo& stack_info = *(crashDumpThreadStacks.rbegin());
    std::thread::id tid = std::this_thread::get_id();
    stack_info.tidHash = std::hash<std::thread::id>{}(tid) % 0x10000;
#ifdef __linux__
    stack_info.kernelTid = (uint64_t)syscall(SYS_gettid);
#endif
    stack_info.crashOrigin = crash_origin;
    for (size_t ii=0; ii<len; ++ii) {
        stack_info.stackPtrs.push_back(stack_ptr[ii]);
    }
#endif
}